

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkSamplerMipmapMode Diligent::FilterTypeToVkMipmapMode(FILTER_TYPE FilterType)

{
  uint uVar1;
  undefined7 in_register_00000039;
  string msg;
  
  uVar1 = (uint)CONCAT71(in_register_00000039,FilterType);
  if (uVar1 < 0xd) {
    if ((0x1b6cU >> (uVar1 & 0x1f) & 1) != 0) {
      return VK_SAMPLER_MIPMAP_MODE_LINEAR;
    }
    if ((0x492U >> (uVar1 & 0x1f) & 1) != 0) {
      return VK_SAMPLER_MIPMAP_MODE_NEAREST;
    }
    FormatString<char[20]>(&msg,(char (*) [20])"Unknown filter type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"FilterTypeToVkMipmapMode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x47c);
  }
  else {
    FormatString<char[63]>
              (&msg,(char (*) [63])"Only point and linear filter types are allowed for mipmap mode")
    ;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"FilterTypeToVkMipmapMode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x490);
  }
  std::__cxx11::string::~string((string *)&msg);
  return VK_SAMPLER_MIPMAP_MODE_NEAREST;
}

Assistant:

VkSamplerMipmapMode FilterTypeToVkMipmapMode(FILTER_TYPE FilterType)
{
    switch (FilterType)
    {
        case FILTER_TYPE_UNKNOWN:
            UNEXPECTED("Unknown filter type");
            return VK_SAMPLER_MIPMAP_MODE_NEAREST;

        case FILTER_TYPE_POINT:
        case FILTER_TYPE_COMPARISON_POINT:
        case FILTER_TYPE_MINIMUM_POINT:
        case FILTER_TYPE_MAXIMUM_POINT:
            return VK_SAMPLER_MIPMAP_MODE_NEAREST;

        case FILTER_TYPE_LINEAR:
        case FILTER_TYPE_ANISOTROPIC:
        case FILTER_TYPE_COMPARISON_LINEAR:
        case FILTER_TYPE_COMPARISON_ANISOTROPIC:
        case FILTER_TYPE_MINIMUM_LINEAR:
        case FILTER_TYPE_MINIMUM_ANISOTROPIC:
        case FILTER_TYPE_MAXIMUM_LINEAR:
        case FILTER_TYPE_MAXIMUM_ANISOTROPIC:
            return VK_SAMPLER_MIPMAP_MODE_LINEAR;

        default:
            UNEXPECTED("Only point and linear filter types are allowed for mipmap mode");
            return VK_SAMPLER_MIPMAP_MODE_NEAREST;
    }
}